

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * cmQtAutoGen::GeneratorNameUpper_abi_cxx11_(GenT genType)

{
  string *psStack_10;
  GenT genType_local;
  
  switch(genType) {
  case GEN:
    psStack_10 = &GenAUTOGEN_abi_cxx11_;
    break;
  case MOC:
    psStack_10 = &GenAUTOMOC_abi_cxx11_;
    break;
  case UIC:
    psStack_10 = &GenAUTOUIC_abi_cxx11_;
    break;
  case RCC:
    psStack_10 = &GenAUTORCC_abi_cxx11_;
    break;
  default:
    psStack_10 = &GenAUTOGEN_abi_cxx11_;
  }
  return psStack_10;
}

Assistant:

std::string const& cmQtAutoGen::GeneratorNameUpper(GenT genType)
{
  switch (genType) {
    case GenT::GEN:
      return GenAUTOGEN;
    case GenT::MOC:
      return GenAUTOMOC;
    case GenT::UIC:
      return GenAUTOUIC;
    case GenT::RCC:
      return GenAUTORCC;
  }
  return GenAUTOGEN;
}